

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void common_embd_normalize(float *inp,float *out,int n,int embd_norm)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 1.0;
  if (embd_norm != -1) {
    if (embd_norm == 0) {
      if (n < 1) {
        dVar2 = 0.0;
      }
      else {
        uVar1 = 0;
        dVar3 = 0.0;
        do {
          dVar2 = (double)ABS(inp[uVar1]);
          if ((double)ABS(inp[uVar1]) <= dVar3) {
            dVar2 = dVar3;
          }
          uVar1 = uVar1 + 1;
          dVar3 = dVar2;
        } while ((uint)n != uVar1);
      }
      dVar2 = dVar2 / 32760.0;
    }
    else if (embd_norm == 2) {
      dVar2 = 0.0;
      if (0 < n) {
        uVar1 = 0;
        do {
          dVar2 = dVar2 + (double)(inp[uVar1] * inp[uVar1]);
          uVar1 = uVar1 + 1;
        } while ((uint)n != uVar1);
      }
      if (0.0 <= dVar2) {
        dVar2 = SQRT(dVar2);
      }
      else {
        dVar2 = sqrt(dVar2);
      }
    }
    else {
      if (n < 1) {
        dVar2 = 0.0;
      }
      else {
        dVar2 = 0.0;
        uVar1 = 0;
        do {
          dVar3 = pow((double)ABS(inp[uVar1]),(double)embd_norm);
          dVar2 = dVar2 + dVar3;
          uVar1 = uVar1 + 1;
        } while ((uint)n != uVar1);
      }
      dVar2 = pow(dVar2,1.0 / (double)embd_norm);
    }
  }
  if (0 < n) {
    uVar1 = 0;
    do {
      out[uVar1] = inp[uVar1] * (float)(double)(-(ulong)(0.0 < dVar2) & (ulong)(1.0 / dVar2));
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

void common_embd_normalize(const float * inp, float * out, int n, int embd_norm) {
    double sum = 0.0;

    switch (embd_norm) {
        case -1: // no normalisation
            sum = 1.0;
            break;
        case 0: // max absolute
            for (int i = 0; i < n; i++) {
                if (sum < std::abs(inp[i])) {
                    sum = std::abs(inp[i]);
                }
            }
            sum /= 32760.0; // make an int16 range
            break;
        case 2: // euclidean
            for (int i = 0; i < n; i++) {
                sum += inp[i] * inp[i];
            }
            sum = std::sqrt(sum);
            break;
        default: // p-norm (euclidean is p-norm p=2)
            for (int i = 0; i < n; i++) {
                sum += std::pow(std::abs(inp[i]), embd_norm);
            }
            sum = std::pow(sum, 1.0 / embd_norm);
            break;
    }

    const float norm = sum > 0.0 ? 1.0 / sum : 0.0f;

    for (int i = 0; i < n; i++) {
        out[i] = inp[i] * norm;
    }
}